

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tokenizer.cc
# Opt level: O0

char * tokenTypeName(token_type_e ttype)

{
  char *pcStack_10;
  token_type_e ttype_local;
  
  switch(ttype) {
  case tt_bad:
    pcStack_10 = "bad";
    break;
  case tt_array_close:
    pcStack_10 = "array_close";
    break;
  case tt_array_open:
    pcStack_10 = "array_open";
    break;
  case tt_brace_close:
    pcStack_10 = "brace_close";
    break;
  case tt_brace_open:
    pcStack_10 = "brace_open";
    break;
  case tt_dict_close:
    pcStack_10 = "dict_close";
    break;
  case tt_dict_open:
    pcStack_10 = "dict_open";
    break;
  case tt_integer:
    pcStack_10 = "integer";
    break;
  case tt_name:
    pcStack_10 = "name";
    break;
  case tt_real:
    pcStack_10 = "real";
    break;
  case tt_string:
    pcStack_10 = "string";
    break;
  case tt_null:
    pcStack_10 = "null";
    break;
  case tt_bool:
    pcStack_10 = "bool";
    break;
  case tt_word:
    pcStack_10 = "word";
    break;
  case tt_eof:
    pcStack_10 = "eof";
    break;
  case tt_space:
    pcStack_10 = "space";
    break;
  case tt_comment:
    pcStack_10 = "comment";
    break;
  case tt_inline_image:
    pcStack_10 = "inline-image";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static char const*
tokenTypeName(QPDFTokenizer::token_type_e ttype)
{
    // Do this is a case statement instead of a lookup so the compiler
    // will warn if we miss any.
    switch (ttype) {
    case QPDFTokenizer::tt_bad:
        return "bad";
    case QPDFTokenizer::tt_array_close:
        return "array_close";
    case QPDFTokenizer::tt_array_open:
        return "array_open";
    case QPDFTokenizer::tt_brace_close:
        return "brace_close";
    case QPDFTokenizer::tt_brace_open:
        return "brace_open";
    case QPDFTokenizer::tt_dict_close:
        return "dict_close";
    case QPDFTokenizer::tt_dict_open:
        return "dict_open";
    case QPDFTokenizer::tt_integer:
        return "integer";
    case QPDFTokenizer::tt_name:
        return "name";
    case QPDFTokenizer::tt_real:
        return "real";
    case QPDFTokenizer::tt_string:
        return "string";
    case QPDFTokenizer::tt_null:
        return "null";
    case QPDFTokenizer::tt_bool:
        return "bool";
    case QPDFTokenizer::tt_word:
        return "word";
    case QPDFTokenizer::tt_eof:
        return "eof";
    case QPDFTokenizer::tt_space:
        return "space";
    case QPDFTokenizer::tt_comment:
        return "comment";
    case QPDFTokenizer::tt_inline_image:
        return "inline-image";
    }
    return nullptr;
}